

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

Aig_Man_t * Saig_SynchSequenceApply(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Str_t *p;
  abctime aVar4;
  Vec_Ptr_t *vSimInfo_00;
  abctime clk;
  int RetValue;
  Vec_Ptr_t *vSimInfo;
  Vec_Str_t *vSequence;
  Aig_Man_t *pAigZero;
  int fVerbose_local;
  int nWords_local;
  Aig_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  p = Saig_SynchSequence(pAig,nWords);
  if (p == (Vec_Str_t *)0x0) {
    printf("Design 1: Synchronizing sequence is not found. ");
  }
  else if (fVerbose != 0) {
    iVar2 = Vec_StrSize(p);
    iVar1 = Saig_ManPiNum(pAig);
    printf("Design 1: Synchronizing sequence of length %4d is found. ",
           (long)iVar2 / (long)iVar1 & 0xffffffff,(long)iVar2 % (long)iVar1 & 0xffffffff);
  }
  if (fVerbose == 0) {
    printf("\n");
  }
  else {
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  if (p == (Vec_Str_t *)0x0) {
    printf("Quitting synchronization.\n");
    pAig_local = (Aig_Man_t *)0x0;
  }
  else {
    iVar2 = Aig_ManObjNumMax(pAig);
    vSimInfo_00 = Vec_PtrAllocSimInfo(iVar2,1);
    iVar2 = Saig_SynchSequenceRun(pAig,vSimInfo_00,p,1);
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x214,"Aig_Man_t *Saig_SynchSequenceApply(Aig_Man_t *, int, int)");
    }
    pAig_local = Saig_ManDupInitZero(pAig);
    Vec_PtrFree(vSimInfo_00);
    Vec_StrFree(p);
    Aig_ManCleanMarkA(pAig);
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Saig_SynchSequenceApply( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Aig_Man_t * pAigZero;
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;

clk = Abc_Clock();
    // derive synchronization sequence
    vSequence = Saig_SynchSequence( pAig, nWords );
    if ( vSequence == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSequence) / Saig_ManPiNum(pAig) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );
    if ( vSequence == NULL )
    {
        printf( "Quitting synchronization.\n" );
        return NULL;
    }

    // apply synchronization sequence
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), 1 );
    RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
    assert( RetValue == 0 );
    // duplicate 
    pAigZero = Saig_ManDupInitZero( pAig );
    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSequence );
    Aig_ManCleanMarkA( pAig );
    return pAigZero;
}